

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseExtParsedEnt(xmlParserCtxtPtr ctxt)

{
  setDocumentLocatorSAXFunc p_Var1;
  startDocumentSAXFunc p_Var2;
  endDocumentSAXFunc p_Var3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  xmlChar *pxVar6;
  
  iVar4 = -1;
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    xmlCtxtInitializeLate(ctxt);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var1 = ctxt->sax->setDocumentLocator, p_Var1 != (setDocumentLocatorSAXFunc)0x0)) {
      (*p_Var1)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    pxVar5 = ctxt->input;
    if (*pxVar5->cur == '\0') {
      xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
      pxVar5 = ctxt->input;
    }
    if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlParserGrow(ctxt);
      pxVar5 = ctxt->input;
    }
    pxVar6 = pxVar5->cur;
    if (((((*pxVar6 == '<') && (pxVar6[1] == '?')) && (pxVar6[2] == 'x')) &&
        ((pxVar6[3] == 'm' && (pxVar6[4] == 'l')))) &&
       (((ulong)pxVar6[5] < 0x21 && ((0x100002600U >> ((ulong)pxVar6[5] & 0x3f) & 1) != 0)))) {
      xmlParseXMLDecl(ctxt);
      xmlSkipBlankChars(ctxt);
    }
    else {
      pxVar6 = xmlCharStrdup("1.0");
      ctxt->version = pxVar6;
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var2 = ctxt->sax->startDocument, p_Var2 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var2)(ctxt->userData);
    }
    *(byte *)&ctxt->options = (byte)ctxt->options & 0xef;
    ctxt->validate = 0;
    ctxt->depth = 0;
    xmlParseContentInternal(ctxt);
    if (ctxt->input->cur < ctxt->input->end) {
      xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var3 = ctxt->sax->endDocument, p_Var3 != (endDocumentSAXFunc)0x0)) {
      (*p_Var3)(ctxt->userData);
    }
    iVar4 = -(uint)(ctxt->wellFormed == 0);
  }
  return iVar4;
}

Assistant:

int
xmlParseExtParsedEnt(xmlParserCtxtPtr ctxt) {
    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    xmlCtxtInitializeLate(ctxt);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
    }

    /*
     * Check for the XMLDecl in the Prolog.
     */
    GROW;
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);

    /*
     * Doing validity checking on chunk doesn't make sense
     */
    ctxt->options &= ~XML_PARSE_DTDVALID;
    ctxt->validate = 0;
    ctxt->depth = 0;

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur < ctxt->input->end)
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if (! ctxt->wellFormed) return(-1);
    return(0);
}